

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

BOOL __thiscall
Js::ScriptContext::VerifyAlive
          (ScriptContext *this,BOOL isJSFunction,ScriptContext *requestScriptContext)

{
  bool bVar1;
  BOOL BVar2;
  
  if ((this->super_ScriptContextBase).isClosed == true) {
    if (requestScriptContext == (ScriptContext *)0x0) {
      requestScriptContext = this;
    }
    bVar1 = ThreadContext::RecordImplicitException(this->threadContext);
    BVar2 = 0;
    if (bVar1) {
      if (isJSFunction == 0) {
        JavascriptError::MapAndThrowError(requestScriptContext,-0x7ff8fffb);
      }
      JavascriptError::MapAndThrowError(requestScriptContext,-0x7ff5ec6d);
    }
  }
  else {
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

BOOL ScriptContext::VerifyAlive(BOOL isJSFunction, ScriptContext* requestScriptContext)
    {
        if (isClosed)
        {
            if (!requestScriptContext)
            {
                requestScriptContext = this;
            }

#if ENABLE_PROFILE_INFO
            if (!GetThreadContext()->RecordImplicitException())
            {
                return FALSE;
            }
#endif
            if (isJSFunction)
            {
                Js::JavascriptError::MapAndThrowError(requestScriptContext, JSERR_CantExecute);
            }
            else
            {
                Js::JavascriptError::MapAndThrowError(requestScriptContext, E_ACCESSDENIED);
            }
        }
        return TRUE;
    }